

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O3

sym_t * get_sym(char *id)

{
  uint uVar1;
  sym_t **ppsVar2;
  sym_t *__s1;
  int iVar3;
  ulong uVar4;
  symtbl_t *psVar5;
  
  psVar5 = scope;
  do {
    uVar1 = psVar5->num_syms;
    if ((ulong)uVar1 != 0) {
      ppsVar2 = psVar5->syms;
      uVar4 = 0;
      do {
        __s1 = ppsVar2[uVar4];
        iVar3 = strcmp(__s1->id,id);
        if (iVar3 == 0) {
          return __s1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    psVar5 = psVar5->parent;
  } while (psVar5 != (symtbl_t *)0x0);
  return (sym_t *)0x0;
}

Assistant:

sym_t* get_sym(const char *id)
{
    unsigned int i;
    symtbl_t* scp = scope;
    do
    {
        for (i = 0; i < scp->num_syms; i++)
        {
            if (strcmp(scp->syms[i]->id, id) == 0)
                return scp->syms[i];
        }
        scp = scp->parent;
    } while (scp != NULL);

    return NULL;
}